

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O2

int quicly_sendstate_acked
              (quicly_sendstate_t *state,quicly_sendstate_sent_t *args,size_t *bytes_to_shift)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = ((state->acked).ranges)->end;
  iVar2 = quicly_ranges_add(&state->acked,args->start,args->end);
  if (iVar2 == 0) {
    iVar2 = quicly_ranges_subtract(&state->pending,args->start,args->end);
    if (iVar2 == 0) {
      uVar3 = ((state->acked).ranges)->end;
      if (((state->pending).num_ranges != 0) && (((state->pending).ranges)->start < uVar3)) {
        __assert_fail("state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                      ,0x82,
                      "int quicly_sendstate_acked(quicly_sendstate_t *, quicly_sendstate_sent_t *, size_t *)"
                     );
      }
      if (uVar1 == uVar3) {
        sVar4 = 0;
      }
      else {
        if (state->final_size < uVar3) {
          if (uVar3 != state->final_size + 1) {
            __assert_fail("sent_upto == state->final_size + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                          ,0x89,
                          "int quicly_sendstate_acked(quicly_sendstate_t *, quicly_sendstate_sent_t *, size_t *)"
                         );
          }
          uVar3 = uVar3 - 1;
        }
        sVar4 = uVar3 - uVar1;
      }
      *bytes_to_shift = sVar4;
      iVar2 = check_amount_of_state(state);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int quicly_sendstate_acked(quicly_sendstate_t *state, quicly_sendstate_sent_t *args, size_t *bytes_to_shift)
{
    uint64_t prev_sent_upto = state->acked.ranges[0].end;
    int ret;

    /* adjust acked and pending ranges */
    if ((ret = quicly_ranges_add(&state->acked, args->start, args->end)) != 0)
        return ret;
    if ((ret = quicly_ranges_subtract(&state->pending, args->start, args->end)) != 0)
        return ret;
    assert(state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start);

    /* calculate number of bytes that can be retired from the send buffer */
    if (prev_sent_upto != state->acked.ranges[0].end) {
        uint64_t sent_upto = state->acked.ranges[0].end;
        if (sent_upto > state->final_size) {
            /* adjust EOS position */
            assert(sent_upto == state->final_size + 1);
            --sent_upto;
        }
        *bytes_to_shift = sent_upto - prev_sent_upto;
    } else {
        *bytes_to_shift = 0;
    }

    return check_amount_of_state(state);
}